

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O1

void __thiscall
websocketpp::connection<websocketpp::config::asio>::log_http_result
          (connection<websocketpp::config::asio> *this)

{
  header_list *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Base_ptr p_Var3;
  element_type *peVar4;
  pointer pcVar5;
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_01;
  size_type sVar6;
  bool bVar7;
  const_iterator cVar8;
  ostream *poVar9;
  ulong uVar10;
  size_t in_RCX;
  _Base_ptr p_Var11;
  string ua;
  stringstream s;
  key_type local_278;
  string local_258;
  char *local_238;
  long local_230;
  char local_228 [16];
  char *local_218;
  long local_210;
  char local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  key_type local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  bVar7 = processor::is_websocket_handshake<websocketpp::http::parser::request>(&this->m_request);
  if (bVar7) {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              ((this->m_alog).
               super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,0x400,"Call to log_http_result for WebSocket",in_RCX);
  }
  else {
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"host","");
    this_00 = &(this->m_request).super_parser.m_headers;
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_websocketpp::utility::ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_278);
    p_Var1 = &(this->m_request).super_parser.m_headers._M_t._M_impl.super__Rb_tree_header;
    p_Var11 = cVar8._M_node + 2;
    if ((_Rb_tree_header *)cVar8._M_node == p_Var1) {
      p_Var11 = (_Base_ptr)&http::empty_header_abi_cxx11_;
    }
    p_Var3 = p_Var11->_M_parent;
    if (p_Var3 == (_Base_ptr)0x0) {
      local_238 = local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"-","");
    }
    else {
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"host","");
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_websocketpp::utility::ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&this_00->_M_t,&local_1d8);
      p_Var11 = cVar8._M_node + 2;
      if ((_Rb_tree_header *)cVar8._M_node == p_Var1) {
        p_Var11 = (_Base_ptr)&http::empty_header_abi_cxx11_;
      }
      local_238 = local_228;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,*(long *)p_Var11,
                 (long)&p_Var11->_M_parent->_M_color + *(long *)p_Var11);
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_238,local_230);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    transport::asio::connection<websocketpp::config::asio::transport_config>::
    get_remote_endpoint_abi_cxx11_(&local_258,&this->super_transport_con_type);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_258._M_dataplus._M_p,local_258._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," \"",2);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(this->m_request).m_method._M_dataplus._M_p,
                        (this->m_request).m_method._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    peVar4 = (this->m_uri).super___shared_ptr<websocketpp::uri,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar4 == (element_type *)0x0) {
      local_218 = local_208;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"-","");
    }
    else {
      local_218 = local_208;
      pcVar5 = (peVar4->m_resource)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,pcVar5,pcVar5 + (peVar4->m_resource)._M_string_length);
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_218,local_210);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(this->m_request).super_parser.m_version._M_dataplus._M_p,
                        (this->m_request).super_parser.m_version._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" ",2);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(this->m_response).m_status_code);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    if (local_218 != local_208) {
      operator_delete(local_218);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    if (local_238 != local_228) {
      operator_delete(local_238);
    }
    paVar2 = &local_278.field_2;
    if ((p_Var3 != (_Base_ptr)0x0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2)) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar2) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    local_278._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"User-Agent","");
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_websocketpp::utility::ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_278);
    p_Var11 = cVar8._M_node + 2;
    if ((_Rb_tree_header *)cVar8._M_node == p_Var1) {
      p_Var11 = (_Base_ptr)&http::empty_header_abi_cxx11_;
    }
    local_238 = local_228;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,*(long *)p_Var11,
               (long)&p_Var11->_M_parent->_M_color + *(long *)p_Var11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar2) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    if (local_230 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," \"\" ",4);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," \"",2);
      local_1f8 = &local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,local_238,local_238 + local_230);
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"\"","");
      local_218 = local_208;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"\\\"","");
      p_Var11 = (_Base_ptr)local_258._M_string_length;
      uVar10 = std::__cxx11::string::find((char *)&local_1f8,(ulong)local_258._M_dataplus._M_p,0);
      if (uVar10 != 0xffffffffffffffff) {
        do {
          std::__cxx11::string::replace
                    ((ulong)&local_1f8,uVar10,(char *)local_258._M_string_length,(ulong)local_218);
          p_Var11 = (_Base_ptr)local_258._M_string_length;
          uVar10 = std::__cxx11::string::find
                             ((char *)&local_1f8,(ulong)local_258._M_dataplus._M_p,
                              uVar10 + local_210);
        } while (uVar10 != 0xffffffffffffffff);
      }
      sVar6 = local_1f0;
      if (local_1f8 == &local_1e8) {
        local_278.field_2._8_8_ = local_1e8._8_8_;
        local_278._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_278._M_dataplus._M_p = (pointer)local_1f8;
      }
      local_278._M_string_length = local_1f0;
      local_1f0 = 0;
      local_1e8._M_local_buf[0] = '\0';
      local_1f8 = &local_1e8;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_278._M_dataplus._M_p,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" ",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if (local_218 != local_208) {
        operator_delete(local_218);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8);
      }
    }
    this_01 = (this->m_alog).
              super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    std::__cxx11::stringbuf::str();
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (this_01,0x1000,&local_278,(size_t)p_Var11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar2) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    if (local_238 != local_228) {
      operator_delete(local_238);
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void connection<config>::log_http_result() {
    std::stringstream s;

    if (processor::is_websocket_handshake(m_request)) {
        m_alog->write(log::alevel::devel,"Call to log_http_result for WebSocket");
        return;
    }  

    // Connection Type
    s << (m_request.get_header("host").empty() ? "-" : m_request.get_header("host"))
      << " " << transport_con_type::get_remote_endpoint()
      << " \"" << m_request.get_method() 
      << " " << (m_uri ? m_uri->get_resource() : "-") 
      << " " << m_request.get_version() << "\" " << m_response.get_status_code()
      << " " << m_response.get_body().size();
    
    // User Agent
    std::string ua = m_request.get_header("User-Agent");
    if (ua.empty()) {
        s << " \"\" ";
    } else {
        // check if there are any quotes in the user agent
        s << " \"" << utility::string_replace_all(ua,"\"","\\\"") << "\" ";
    }

    m_alog->write(log::alevel::http,s.str());
}